

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int int32_decode(cram_fd *fd,int32_t *val)

{
  ssize_t sVar1;
  int32_t local_24;
  int32_t *piStack_20;
  int32_t i;
  int32_t *val_local;
  cram_fd *fd_local;
  
  piStack_20 = val;
  val_local = (int32_t *)fd;
  sVar1 = hread(fd->fp,&local_24,4);
  if (sVar1 == 4) {
    *piStack_20 = local_24;
    fd_local._4_4_ = 4;
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int int32_decode(cram_fd *fd, int32_t *val) {
    int32_t i;
    if (4 != hread(fd->fp, &i, 4))
	return -1;

    *val = le_int4(i);
    return 4;
}